

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

bool QChar::isSpace_helper(char32_t ucs4)

{
  Properties *pPVar1;
  
  if (0x10ffff < (uint)ucs4) {
    return false;
  }
  pPVar1 = QUnicodeTables::qGetProp(ucs4);
  return (0x1c0U >> (*(byte *)pPVar1 & 0x1f) & 1) != 0;
}

Assistant:

bool QT_FASTCALL QChar::isSpace_helper(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Separator_Space) |
                     FLAG(Separator_Line) |
                     FLAG(Separator_Paragraph);
    return FLAG(qGetProp(ucs4)->category) & test;
}